

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.cc
# Opt level: O0

void __thiscall
Pl_RC4::Pl_RC4(Pl_RC4 *this,char *identifier,Pipeline *next,uchar *key_data,int key_len,
              size_t out_bufsize)

{
  logic_error *this_00;
  undefined4 in_register_00000084;
  shared_ptr<unsigned_char> local_58 [2];
  size_t local_38;
  size_t out_bufsize_local;
  RC4_KEY *pRStack_28;
  int key_len_local;
  uchar *key_data_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_RC4 *this_local;
  
  local_38 = out_bufsize;
  out_bufsize_local._4_4_ = key_len;
  pRStack_28 = (RC4_KEY *)key_data;
  key_data_local = (uchar *)next;
  next_local = (Pipeline *)identifier;
  identifier_local = (char *)this;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_RC4_0058b5f8;
  std::shared_ptr<unsigned_char>::shared_ptr(&this->outbuf);
  this->out_bufsize = local_38;
  RC4::RC4(&this->rc4,pRStack_28,(ulong)out_bufsize_local._4_4_,key_data,
           (uchar *)CONCAT44(in_register_00000084,key_len));
  if (key_data_local == (uchar *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_RC4 with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QUtil::make_shared_array<unsigned_char>((QUtil *)local_58,local_38);
  std::shared_ptr<unsigned_char>::operator=(&this->outbuf,local_58);
  std::shared_ptr<unsigned_char>::~shared_ptr(local_58);
  return;
}

Assistant:

Pl_RC4::Pl_RC4(
    char const* identifier,
    Pipeline* next,
    unsigned char const* key_data,
    int key_len,
    size_t out_bufsize) :
    Pipeline(identifier, next),
    out_bufsize(out_bufsize),
    rc4(key_data, key_len)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_RC4 with nullptr as next");
    }
    this->outbuf = QUtil::make_shared_array<unsigned char>(out_bufsize);
}